

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestProgram::getUniformLocation
          (SRGBTestProgram *this,string *name)

{
  __type _Var1;
  size_type sVar2;
  reference pvVar3;
  TestError *this_00;
  ulong local_20;
  size_t idx;
  string *name_local;
  SRGBTestProgram *this_local;
  
  local_20 = 0;
  while( true ) {
    sVar2 = std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
            ::size(&this->m_uniformDataList);
    if (sVar2 <= local_20) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,
                 "Error: If name correctly requested then glGetActiveUniforms() returned active uniform data incorrectly"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                 ,0x2e5);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    pvVar3 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
             ::operator[](&this->m_uniformDataList,local_20);
    _Var1 = std::operator==(&pvVar3->name,name);
    if (_Var1) break;
    local_20 = local_20 + 1;
  }
  pvVar3 = std::
           vector<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
           ::operator[](&this->m_uniformDataList,local_20);
  return pvVar3->location;
}

Assistant:

int SRGBTestProgram::getUniformLocation (const std::string& name)
{
	for (std::size_t idx = 0; idx < m_uniformDataList.size(); idx++)
	{
		if (m_uniformDataList[idx].name == name)
		{
			return m_uniformDataList[idx].location;
		}
	}

	TCU_THROW(TestError, "Error: If name correctly requested then glGetActiveUniforms() returned active uniform data incorrectly");
	return -1;
}